

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::InternalRunDeathTestFlag::~InternalRunDeathTestFlag
          (InternalRunDeathTestFlag *this)

{
  InternalRunDeathTestFlag *this_local;
  
  if (-1 < this->write_fd_) {
    posix::Close(this->write_fd_);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~InternalRunDeathTestFlag() {
    if (write_fd_ >= 0)
      posix::Close(write_fd_);
  }